

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_d00101::BIP32PubkeyProvider::GetPrivKey
          (BIP32PubkeyProvider *this,int pos,SigningProvider *arg,CKey *key)

{
  long lVar1;
  undefined1 uVar2;
  CExtKey *in_RCX;
  SigningProvider *in_RDX;
  undefined4 in_ESI;
  CExtKey *in_RDI;
  long in_FS_OFFSET;
  CExtKey dummy;
  CExtKey extkey;
  CExtKey *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff35;
  undefined1 in_stack_ffffffffffffff36;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  CExtKey *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff60;
  bool local_89;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CExtKey::CExtKey(in_stack_ffffffffffffff28);
  CExtKey::CExtKey(in_stack_ffffffffffffff28);
  uVar2 = GetDerivedExtKey((BIP32PubkeyProvider *)CONCAT44(in_ESI,in_stack_ffffffffffffff60),in_RDX,
                           in_RCX,in_stack_ffffffffffffff48);
  if ((bool)uVar2) {
    if (*(int *)(in_RDI[2].chaincode.super_base_blob<256U>.m_data._M_elems + 0xc) == 1) {
      in_stack_ffffffffffffff36 =
           CExtKey::Derive((CExtKey *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_RDI,CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffff36,
                                                          CONCAT11(in_stack_ffffffffffffff35,
                                                                   in_stack_ffffffffffffff34))));
      if (!(bool)in_stack_ffffffffffffff36) {
        local_89 = false;
        goto LAB_006fac81;
      }
    }
    if (*(int *)(in_RDI[2].chaincode.super_base_blob<256U>.m_data._M_elems + 0xc) == 2) {
      in_stack_ffffffffffffff35 =
           CExtKey::Derive((CExtKey *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_RDI,CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffff36,
                                                          CONCAT11(in_stack_ffffffffffffff35,
                                                                   in_stack_ffffffffffffff34))));
      if (!(bool)in_stack_ffffffffffffff35) {
        local_89 = false;
        goto LAB_006fac81;
      }
    }
    CKey::operator=((CKey *)in_RDI,
                    (CKey *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff36,
                                                    CONCAT15(in_stack_ffffffffffffff35,
                                                             CONCAT14(in_stack_ffffffffffffff34,
                                                                      in_stack_ffffffffffffff30)))))
    ;
    local_89 = true;
  }
  else {
    local_89 = false;
  }
LAB_006fac81:
  CExtKey::~CExtKey(in_stack_ffffffffffffff28);
  CExtKey::~CExtKey(in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_89;
  }
  __stack_chk_fail();
}

Assistant:

bool GetPrivKey(int pos, const SigningProvider& arg, CKey& key) const override
    {
        CExtKey extkey;
        CExtKey dummy;
        if (!GetDerivedExtKey(arg, extkey, dummy)) return false;
        if (m_derive == DeriveType::UNHARDENED && !extkey.Derive(extkey, pos)) return false;
        if (m_derive == DeriveType::HARDENED && !extkey.Derive(extkey, pos | 0x80000000UL)) return false;
        key = extkey.key;
        return true;
    }